

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  this->depth = 0;
  this->width = 0;
  this->height = 0;
  this->n = 0;
  this->pixel = (uchar *)0x0;
  this->row = (uchar **)0x0;
  this->img = (uchar ***)0x0;
  setSize(this,a->width,a->height,(long)a->depth);
  memcpy(this->pixel,a->pixel,this->n);
  return;
}

Assistant:

Image(const Image<T> &a)
    {
      depth=0;
      width=0;
      height=0;
      n=0;
      pixel=0;
      row=0;
      img=0;

      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      memcpy(pixel, a.pixel, n*sizeof(T));
    }